

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::print_update(search_private *priv)

{
  double dVar1;
  vw *all;
  undefined1 auVar2 [16];
  bool bVar3;
  shared_data *psVar4;
  char *pcVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char total_pred [8];
  float local_d8;
  float fStack_d4;
  char total_exge [8];
  char total_cach [8];
  char inst_cntr [9];
  char pred_label [21];
  char true_label [21];
  string local_70;
  string local_50;
  
  all = priv->all;
  if ((priv->printed_output_header == false) && (all->quiet == false)) {
    fprintf(_stderr,"%-10s %-10s %8s%24s %22s %5s %5s  %7s  %7s  %7s  %-8s\n","average","since",
            "instance","current true","current predicted","cur","cur","predic","cache","examples",""
           );
    pcVar5 = "beta";
    if (priv->active_csoaa != false) {
      pcVar5 = "#run";
    }
    fprintf(_stderr,"%-10s %-10s %8s%24s %22s %5s %5s  %7s  %7s  %7s  %-8s\n","loss","last",
            "counter","output prefix","output prefix","pass","pol","made","hits","gener",pcVar5);
    *(undefined8 *)(fwrite + *(long *)(std::cerr + -0x18)) = 5;
    priv->printed_output_header = true;
  }
  bVar3 = should_print_update(all,false);
  if (!bVar3) {
    return;
  }
  std::__cxx11::stringbuf::str();
  to_short_string(&local_50,0x14,true_label);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::stringbuf::str();
  to_short_string(&local_70,0x14,pred_label);
  std::__cxx11::string::~string((string *)&local_70);
  if (all->holdout_set_off == true) {
    psVar4 = all->sd;
  }
  else {
    psVar4 = all->sd;
    if ((all->current_pass != 0) && (0.0 < psVar4->weighted_holdout_examples)) {
      dVar1 = psVar4->weighted_holdout_examples_since_last_dump;
      auVar8._4_4_ = (float)psVar4->holdout_sum_loss_since_last_dump;
      auVar8._0_4_ = (float)psVar4->holdout_sum_loss;
      auVar8._8_8_ = 0;
      fVar6 = (float)psVar4->weighted_holdout_examples;
      auVar10._4_4_ = (float)dVar1;
      auVar10._0_4_ = fVar6;
      auVar10._8_8_ = 0;
      auVar10 = divps(auVar8,auVar10);
      psVar4->weighted_holdout_examples_since_last_dump = 0.0;
      all->sd->holdout_sum_loss_since_last_dump = 0.0;
      local_d8 = (float)(-(uint)(fVar6 != 0.0) & auVar10._0_4_);
      fStack_d4 = (float)(-(uint)((float)dVar1 != 0.0) & auVar10._4_4_);
      psVar4 = all->sd;
      bVar3 = true;
      goto LAB_00212bba;
    }
  }
  auVar9._0_4_ = (float)psVar4->sum_loss;
  auVar9._4_4_ = (float)psVar4->sum_loss_since_last_dump;
  auVar9._8_8_ = 0;
  fVar6 = (float)psVar4->weighted_labeled_examples;
  fVar7 = (float)(psVar4->weighted_labeled_examples - psVar4->old_weighted_labeled_examples);
  auVar2._4_4_ = fVar7;
  auVar2._0_4_ = fVar6;
  auVar2._8_8_ = 0;
  auVar10 = divps(auVar9,auVar2);
  local_d8 = (float)(-(uint)(fVar6 != 0.0) & auVar10._0_4_);
  fStack_d4 = (float)(-(uint)(fVar7 != 0.0) & auVar10._4_4_);
  bVar3 = false;
LAB_00212bba:
  number_to_natural(psVar4->example_number,inst_cntr);
  number_to_natural(priv->total_predictions_made,total_pred);
  number_to_natural(priv->total_cache_hits,total_cach);
  number_to_natural(priv->total_examples_generated,total_exge);
  fVar6 = (float)priv->num_calls_to_run;
  if (priv->active_csoaa == false) {
    fVar6 = priv->beta;
  }
  fprintf(_stderr,"%-10.6f %-10.6f %8s  [%s] [%s] %5d %5d  %7s  %7s  %7s  %-8f",
          SUB84((double)local_d8,0),(double)fStack_d4,SUB84((double)fVar6,0),inst_cntr,true_label,
          pred_label,(ulong)(uint)priv->read_example_last_pass,(ulong)priv->current_policy,
          total_pred,total_cach,total_exge);
  if (bVar3) {
    fwrite(" h",2,1,_stderr);
  }
  fputc(10,_stderr);
  fflush(_stderr);
  shared_data::update_dump_interval(all->sd,all->progress_add,all->progress_arg);
  return;
}

Assistant:

void print_update(search_private& priv)
{
  vw& all = *priv.all;
  if (!priv.printed_output_header && !all.quiet)
  {
    const char* header_fmt = "%-10s %-10s %8s%24s %22s %5s %5s  %7s  %7s  %7s  %-8s\n";
    fprintf(stderr, header_fmt, "average", "since", "instance", "current true", "current predicted", "cur", "cur",
        "predic", "cache", "examples", "");
    if (priv.active_csoaa)
      fprintf(stderr, header_fmt, "loss", "last", "counter", "output prefix", "output prefix", "pass", "pol", "made",
          "hits", "gener", "#run");
    else
      fprintf(stderr, header_fmt, "loss", "last", "counter", "output prefix", "output prefix", "pass", "pol", "made",
          "hits", "gener", "beta");
    std::cerr.precision(5);
    priv.printed_output_header = true;
  }

  if (!should_print_update(all, priv.hit_new_pass))
    return;

  char true_label[21];
  char pred_label[21];
  to_short_string(priv.truth_string->str(), 20, true_label);
  to_short_string(priv.pred_string->str(), 20, pred_label);

  float avg_loss = 0.;
  float avg_loss_since = 0.;
  bool use_heldout_loss = (!all.holdout_set_off && all.current_pass >= 1) && (all.sd->weighted_holdout_examples > 0);
  if (use_heldout_loss)
  {
    avg_loss = safediv((float)all.sd->holdout_sum_loss, (float)all.sd->weighted_holdout_examples);
    avg_loss_since = safediv(
        (float)all.sd->holdout_sum_loss_since_last_dump, (float)all.sd->weighted_holdout_examples_since_last_dump);

    all.sd->weighted_holdout_examples_since_last_dump = 0;
    all.sd->holdout_sum_loss_since_last_dump = 0.0;
  }
  else
  {
    avg_loss = safediv((float)all.sd->sum_loss, (float)all.sd->weighted_labeled_examples);
    avg_loss_since = safediv((float)all.sd->sum_loss_since_last_dump,
        (float)(all.sd->weighted_labeled_examples - all.sd->old_weighted_labeled_examples));
  }

  char inst_cntr[9];
  number_to_natural((size_t)all.sd->example_number, inst_cntr);
  char total_pred[8];
  number_to_natural(priv.total_predictions_made, total_pred);
  char total_cach[8];
  number_to_natural(priv.total_cache_hits, total_cach);
  char total_exge[8];
  number_to_natural(priv.total_examples_generated, total_exge);

  fprintf(stderr, "%-10.6f %-10.6f %8s  [%s] [%s] %5d %5d  %7s  %7s  %7s  %-8f", avg_loss, avg_loss_since, inst_cntr,
      true_label, pred_label, (int)priv.read_example_last_pass, (int)priv.current_policy, total_pred, total_cach,
      total_exge, priv.active_csoaa ? priv.num_calls_to_run : priv.beta);

  if (PRINT_CLOCK_TIME)
  {
    size_t num_sec = (size_t)(((float)(clock() - priv.start_clock_time)) / CLOCKS_PER_SEC);
    cerr << " " << num_sec << "sec";
  }

  if (use_heldout_loss)
    fprintf(stderr, " h");

  fprintf(stderr, "\n");
  fflush(stderr);
  all.sd->update_dump_interval(all.progress_add, all.progress_arg);
}